

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

mraa_gpio_context mraa_gpio_chardev_init(int *pins,int num_pins)

{
  mraa_pin_t meta;
  int iVar1;
  mraa_boolean_t mVar2;
  mraa_result_t mVar3;
  uchar *puVar4;
  mraa_gpiod_chip_info *__ptr;
  void *pvVar5;
  int *piVar6;
  undefined4 in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  int local_cc;
  int chip;
  int i_3;
  int *counters;
  int i_2;
  int line_in_group;
  mraa_gpiod_chip_info *cinfo;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  int local_48;
  uint local_44;
  int i_1;
  int i;
  mraa_board_t *board;
  mraa_gpiod_group_t gpio_group;
  mraa_gpio_context dev;
  uint local_20;
  int line_offset;
  int chip_id;
  int num_pins_local;
  int *pins_local;
  
  _i_1 = plat;
  line_offset = num_pins;
  _chip_id = pins;
  gpio_group = (mraa_gpiod_group_t)calloc(1,0x88);
  if (gpio_group == (mraa_gpiod_group_t)0x0) {
    syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for context");
    pins_local = (int *)0x0;
  }
  else {
    puVar4 = (uchar *)malloc((long)line_offset << 2);
    gpio_group[1].rw_values = puVar4;
    if (gpio_group[1].rw_values == (uchar *)0x0) {
      syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
      mraa_gpio_close((mraa_gpio_context)gpio_group);
      pins_local = (int *)0x0;
    }
    else {
      iVar1 = mraa_get_number_of_gpio_chips();
      *(int *)&gpio_group[1].gpio_lines = iVar1;
      if (*(int *)&gpio_group[1].gpio_lines == 0) {
        mraa_gpio_close((mraa_gpio_context)gpio_group);
        pins_local = (int *)0x0;
      }
      else {
        *(int *)&gpio_group[1].gpio_group_to_pins_table = line_offset;
        board = (mraa_board_t *)calloc((ulong)*(uint *)&gpio_group[1].gpio_lines,0x40);
        if (board == (mraa_board_t *)0x0) {
          syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
          mraa_gpio_close((mraa_gpio_context)gpio_group);
          pins_local = (int *)0x0;
        }
        else {
          *(mraa_board_t **)&gpio_group[1].num_gpio_lines = board;
          for (local_44 = 0; local_44 < *(uint *)&gpio_group[1].gpio_lines; local_44 = local_44 + 1)
          {
            *(uint *)((long)board->i2c_bus + (long)(int)local_44 * 0x40 + -0xc) = local_44;
            *(undefined8 *)((long)board->i2c_bus + (long)(int)local_44 * 0x40) = 0;
          }
          for (local_48 = 0; local_48 < line_offset; local_48 = local_48 + 1) {
            mVar2 = mraa_is_sub_platform_id(_chip_id[local_48]);
            if (mVar2 != 0) {
              syslog(5,"[GPIOD_INTERFACE]: init: Using sub platform for %d",
                     (ulong)(uint)_chip_id[local_48]);
              _i_1 = _i_1->sub_platform;
              if (_i_1 == (mraa_board_t *)0x0) {
                syslog(3,"[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d",
                       (ulong)(uint)_chip_id[local_48]);
                mraa_gpio_close((mraa_gpio_context)gpio_group);
                return (mraa_gpio_context)0x0;
              }
              iVar1 = mraa_get_sub_platform_index(_chip_id[local_48]);
              _chip_id[local_48] = iVar1;
            }
            if ((_chip_id[local_48] < 0) || (_i_1->phy_pin_count <= _chip_id[local_48])) {
              syslog(3,"[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",
                     (ulong)(uint)_chip_id[local_48],(ulong)(uint)_i_1->phy_pin_count);
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              return (mraa_gpio_context)0x0;
            }
            if ((*(byte *)&_i_1->pins[_chip_id[local_48]].capabilities >> 1 & 1) != 1) {
              syslog(3,"[GPIOD_INTERFACE]: init: pin %d not capable of gpio",
                     (ulong)(uint)_chip_id[local_48]);
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              return (mraa_gpio_context)0x0;
            }
            if (_i_1->pins[_chip_id[local_48]].gpio.mux_total != 0) {
              memcpy(&cinfo,&_i_1->pins[_chip_id[local_48]].gpio,100);
              meta.mux_total = (undefined4)local_a0;
              meta.mux[0].pincmd = local_a0._4_4_;
              meta.pinmap = (undefined4)uStack_a8;
              meta.parent_id = uStack_a8._4_4_;
              meta.mux[0].pin = (undefined4)uStack_98;
              meta.mux[0].value = uStack_98._4_4_;
              meta.mux[1].pincmd = (undefined4)local_90;
              meta.mux[1].pin = local_90._4_4_;
              meta.mux[1].value = (undefined4)uStack_88;
              meta.mux[2].pincmd = uStack_88._4_4_;
              meta.mux[2].pin = (undefined4)local_80;
              meta.mux[2].value = local_80._4_4_;
              meta.mux[3].pincmd = (undefined4)uStack_78;
              meta.mux[3].pin = uStack_78._4_4_;
              meta.mux[3].value = (undefined4)local_70;
              meta.mux[4].pincmd = local_70._4_4_;
              meta.mux[4].pin = (undefined4)uStack_68;
              meta.mux[4].value = uStack_68._4_4_;
              meta.mux[5].pincmd = (undefined4)local_60;
              meta.mux[5].pin = local_60._4_4_;
              meta.mux[5].value = (undefined4)uStack_58;
              meta.output_enable = uStack_58._4_4_;
              meta.complex_cap = (mraa_pin_cap_complex_t)local_50;
              meta.gpio_chip = in_stack_ffffffffffffff2c;
              meta.gpio_line = in_stack_ffffffffffffff30;
              mVar3 = mraa_setup_mux_mapped(meta);
              if (mVar3 != MRAA_SUCCESS) {
                syslog(3,"[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d",
                       (ulong)(uint)_chip_id[local_48]);
                mraa_gpio_close((mraa_gpio_context)gpio_group);
                return (mraa_gpio_context)0x0;
              }
            }
            local_20 = _i_1->pins[_chip_id[local_48]].gpio.gpio_chip;
            dev._4_4_ = _i_1->pins[_chip_id[local_48]].gpio.gpio_line;
            *(uint *)(gpio_group[1].rw_values + (long)local_48 * 4) = local_20;
            if (*(int *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -0x18) == 0) {
              __ptr = mraa_get_chip_info_by_number(local_20);
              if (__ptr == (mraa_gpiod_chip_info *)0x0) {
                syslog(3,"[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d",
                       (ulong)local_20);
                mraa_gpio_close((mraa_gpio_context)gpio_group);
                return (mraa_gpio_context)0x0;
              }
              *(int *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -0x14) = __ptr->chip_fd;
              *(undefined4 *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -0x18) = 1;
              *(undefined4 *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -0x10) =
                   0xffffffff;
              free(__ptr);
            }
            iVar1 = *(int *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -8);
            pvVar5 = realloc(*(void **)((long)board->i2c_bus + (long)(int)local_20 * 0x40),
                             (long)(iVar1 + 1) << 2);
            *(void **)((long)board->i2c_bus + (long)(int)local_20 * 0x40) = pvVar5;
            if (*(long *)((long)board->i2c_bus + (long)(int)local_20 * 0x40) == 0) {
              syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              return (mraa_gpio_context)0x0;
            }
            *(uint *)(*(long *)((long)board->i2c_bus + (long)(int)local_20 * 0x40) + (long)iVar1 * 4
                     ) = dev._4_4_;
            *(int *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -8) =
                 *(int *)((long)board->i2c_bus + (long)(int)local_20 * 0x40 + -8) + 1;
          }
          for (counters._0_4_ = 0; (uint)counters < *(uint *)&gpio_group[1].gpio_lines;
              counters._0_4_ = (uint)counters + 1) {
            pvVar5 = calloc((ulong)*(uint *)((long)board->i2c_bus +
                                            (long)(int)(uint)counters * 0x40 + -8),1);
            *(void **)((long)board->i2c_bus + (long)(int)(uint)counters * 0x40 + 8) = pvVar5;
            if (*(long *)((long)board->i2c_bus + (long)(int)(uint)counters * 0x40 + 8) == 0) {
              syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              return (mraa_gpio_context)0x0;
            }
            pvVar5 = calloc((ulong)*(uint *)((long)board->i2c_bus +
                                            (long)(int)(uint)counters * 0x40 + -8),4);
            *(void **)((long)board->i2c_bus + (long)(int)(uint)counters * 0x40 + 0x10) = pvVar5;
            if (*(long *)((long)board->i2c_bus + (long)(int)(uint)counters * 0x40 + 0x10) == 0) {
              syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              return (mraa_gpio_context)0x0;
            }
            *(undefined8 *)((long)board->i2c_bus + (long)(int)(uint)counters * 0x40 + 0x20) = 0;
          }
          pvVar5 = calloc((ulong)*(uint *)&gpio_group[1].gpio_lines,4);
          if (pvVar5 == (void *)0x0) {
            syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for local variable");
            mraa_gpio_close((mraa_gpio_context)gpio_group);
            pins_local = (int *)0x0;
          }
          else {
            for (local_cc = 0; local_cc < line_offset; local_cc = local_cc + 1) {
              iVar1 = *(int *)(gpio_group[1].rw_values + (long)local_cc * 4);
              *(int *)(*(long *)((long)board->i2c_bus + (long)iVar1 * 0x40 + 0x10) +
                      (long)*(int *)((long)pvVar5 + (long)iVar1 * 4) * 4) = local_cc;
              *(int *)((long)pvVar5 + (long)iVar1 * 4) =
                   *(int *)((long)pvVar5 + (long)iVar1 * 4) + 1;
            }
            free(pvVar5);
            piVar6 = (int *)malloc((ulong)*(uint *)&gpio_group[1].gpio_group_to_pins_table << 2);
            gpio_group[1].event_handles = piVar6;
            if (gpio_group[1].event_handles == (int *)0x0) {
              syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
              mraa_gpio_close((mraa_gpio_context)gpio_group);
              pins_local = (int *)0x0;
            }
            else {
              memcpy(gpio_group[1].event_handles,_chip_id,
                     (ulong)*(uint *)&gpio_group[1].gpio_group_to_pins_table << 2);
              *(undefined8 *)&gpio_group[1].flags = 0;
              pins_local = &gpio_group->is_required;
            }
          }
        }
      }
    }
  }
  return (mraa_gpio_context)pins_local;
}

Assistant:

mraa_gpio_context
mraa_gpio_chardev_init(int pins[], int num_pins)
{
    int chip_id, line_offset;
    mraa_gpio_context dev;
    mraa_gpiod_group_t gpio_group;

    mraa_board_t* board = plat;

    dev = (mraa_gpio_context) calloc(1, sizeof(struct _gpio));
    if (dev == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for context");
        return NULL;
    }

    dev->pin_to_gpio_table = malloc(num_pins * sizeof(int));
    if (dev->pin_to_gpio_table == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_chips = mraa_get_number_of_gpio_chips();
    if (dev->num_chips <= 0) {
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_pins = num_pins;

    gpio_group = calloc(dev->num_chips, sizeof(struct _gpio_group));
    if (gpio_group == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->gpio_group = gpio_group;

    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].gpio_chip = i;
        /* Just to be sure realloc has the desired behaviour. */
        gpio_group[i].gpio_lines = NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        if (mraa_is_sub_platform_id(pins[i])) {
            syslog(LOG_NOTICE, "[GPIOD_INTERFACE]: init: Using sub platform for %d", pins[i]);
            board = board->sub_platform;
            if (board == NULL) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
            pins[i] = mraa_get_sub_platform_index(pins[i]);
        }

        if (pins[i] < 0 || pins[i] >= board->phy_pin_count) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",
                   pins[i], board->phy_pin_count);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].capabilities.gpio != 1) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d not capable of gpio", pins[i]);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].gpio.mux_total > 0) {
            if (mraa_setup_mux_mapped(board->pins[pins[i]].gpio) != MRAA_SUCCESS) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
        }

        chip_id = board->pins[pins[i]].gpio.gpio_chip;
        line_offset = board->pins[pins[i]].gpio.gpio_line;

        /* Map pin to _gpio_group structure. */
        dev->pin_to_gpio_table[i] = chip_id;

        if (!gpio_group[chip_id].is_required) {
            mraa_gpiod_chip_info* cinfo = mraa_get_chip_info_by_number(chip_id);
            if (!cinfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d", chip_id);
                mraa_gpio_close(dev);
                return NULL;
            }

            gpio_group[chip_id].dev_fd = cinfo->chip_fd;
            gpio_group[chip_id].is_required = 1;
            gpio_group[chip_id].gpiod_handle = -1;

            free(cinfo);
        }

        int line_in_group;
        line_in_group = gpio_group[chip_id].num_gpio_lines;
        gpio_group[chip_id].gpio_lines =
        realloc(gpio_group[chip_id].gpio_lines, (line_in_group + 1) * sizeof(unsigned int));
        if (gpio_group[chip_id].gpio_lines == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[chip_id].gpio_lines[line_in_group] = line_offset;
        gpio_group[chip_id].num_gpio_lines++;
    }

    /* Initialize rw_values for read / write multiple functions.
     * Also, allocate memory for inverse map: */
    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].rw_values = calloc(gpio_group[i].num_gpio_lines, sizeof(unsigned char));
        if (gpio_group[i].rw_values == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[i].gpio_group_to_pins_table = calloc(gpio_group[i].num_gpio_lines, sizeof(int));
        if (gpio_group[i].gpio_group_to_pins_table == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        /* Set event handle arrays for all lines contained on a chip to NULL. */
        gpio_group[i].event_handles = NULL;
    }

    /* Finally map the inverse relation between a gpio group and its original pin numbers
     * provided by user. */
    int* counters = calloc(dev->num_chips, sizeof(int));
    if (counters == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for local variable");
        mraa_gpio_close(dev);
        return NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        int chip = dev->pin_to_gpio_table[i];
        gpio_group[chip].gpio_group_to_pins_table[counters[chip]] = i;
        counters[chip]++;
    }
    free(counters);

    /* Save the provided array from the user to our internal structure. */
    dev->provided_pins = malloc(dev->num_pins * sizeof(int));
    if (dev->provided_pins == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    memcpy(dev->provided_pins, pins, dev->num_pins * sizeof(int));

    /* Initialize events array. */
    dev->events = NULL;

    return dev;
}